

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlWarningMsg(xmlParserCtxtPtr ctxt,xmlParserErrors error,char *msg,xmlChar *str1,xmlChar *str2
                  )

{
  xmlGenericErrorFunc local_68;
  xmlStructuredErrorFunc local_58;
  xmlStructuredErrorFunc schannel;
  xmlChar *str2_local;
  xmlChar *str1_local;
  char *msg_local;
  xmlParserErrors error_local;
  xmlParserCtxtPtr ctxt_local;
  
  local_58 = (xmlStructuredErrorFunc)0x0;
  if (((ctxt == (xmlParserCtxtPtr)0x0) || (ctxt->disableSAX == 0)) ||
     (ctxt->instate != XML_PARSER_EOF)) {
    if (((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->sax != (_xmlSAXHandler *)0x0)) &&
       (ctxt->sax->initialized == 0xdeedbeaf)) {
      local_58 = ctxt->sax->serror;
    }
    if (ctxt == (xmlParserCtxtPtr)0x0) {
      __xmlRaiseError(local_58,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,(void *)0x0,1,error,
                      XML_ERR_WARNING,(char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,
                      str1,str2);
    }
    else {
      if (ctxt->sax == (_xmlSAXHandler *)0x0) {
        local_68 = (xmlGenericErrorFunc)0x0;
      }
      else {
        local_68 = ctxt->sax->warning;
      }
      __xmlRaiseError(local_58,local_68,ctxt->userData,ctxt,(void *)0x0,1,error,XML_ERR_WARNING,
                      (char *)0x0,0,(char *)str1,(char *)str2,(char *)0x0,0,0,msg,str1,str2);
    }
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlWarningMsg(xmlParserCtxtPtr ctxt, xmlParserErrors error,
              const char *msg, const xmlChar *str1, const xmlChar *str2)
{
    xmlStructuredErrorFunc schannel = NULL;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if ((ctxt != NULL) && (ctxt->sax != NULL) &&
        (ctxt->sax->initialized == XML_SAX2_MAGIC))
        schannel = ctxt->sax->serror;
    if (ctxt != NULL) {
        __xmlRaiseError(schannel,
                    (ctxt->sax) ? ctxt->sax->warning : NULL,
                    ctxt->userData,
                    ctxt, NULL, XML_FROM_PARSER, error,
                    XML_ERR_WARNING, NULL, 0,
		    (const char *) str1, (const char *) str2, NULL, 0, 0,
		    msg, (const char *) str1, (const char *) str2);
    }